

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDPublicKey.cpp
# Opt level: O2

void __thiscall OSSLEDPublicKey::createOSSLKey(OSSLEDPublicKey *this)

{
  size_t sVar1;
  uchar *puVar2;
  uchar *puVar3;
  EVP_PKEY *pEVar4;
  int iVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ByteString der;
  uchar *p;
  ByteString raw;
  
  if (this->pkey != (EVP_PKEY *)0x0) {
    return;
  }
  ByteString::ByteString(&der);
  DERUTIL::octet2Raw(&raw,&(this->super_EDPublicKey).a);
  sVar1 = ByteString::size(&raw);
  if (sVar1 == 0) goto LAB_0011f7fa;
  iVar5 = this->nid;
  if (iVar5 == 0x440) {
    if (sVar1 != 0x39) {
      uVar6 = 0x39;
      iVar5 = 0xf5;
      goto LAB_0011f7d7;
    }
    ByteString::resize(&der,0x45);
    puVar2 = ByteString::operator[](&der,0);
    builtin_memcpy(puVar2,"0C0\x05\x06\x03+eq\x03:",0xc);
    puVar2 = ByteString::operator[](&der,0xc);
    puVar3 = ByteString::const_byte_str(&raw);
    uVar7 = *(undefined4 *)puVar3;
    uVar8 = *(undefined4 *)(puVar3 + 4);
    uVar9 = *(undefined4 *)(puVar3 + 8);
    uVar10 = *(undefined4 *)(puVar3 + 0xc);
    uVar11 = *(undefined4 *)(puVar3 + 0x10);
    uVar12 = *(undefined4 *)(puVar3 + 0x14);
    uVar13 = *(undefined4 *)(puVar3 + 0x18);
    uVar14 = *(undefined4 *)(puVar3 + 0x1c);
    uVar15 = *(undefined4 *)(puVar3 + 0x20);
    uVar16 = *(undefined4 *)(puVar3 + 0x24);
    uVar17 = *(undefined4 *)(puVar3 + 0x28);
    uVar18 = *(undefined4 *)(puVar3 + 0x2c);
    uVar6 = *(undefined8 *)(puVar3 + 0x31);
    *(undefined8 *)(puVar2 + 0x29) = *(undefined8 *)(puVar3 + 0x29);
    *(undefined8 *)(puVar2 + 0x31) = uVar6;
LAB_0011f76f:
    *(undefined4 *)(puVar2 + 0x20) = uVar15;
    *(undefined4 *)(puVar2 + 0x24) = uVar16;
    *(undefined4 *)(puVar2 + 0x28) = uVar17;
    *(undefined4 *)(puVar2 + 0x2c) = uVar18;
  }
  else {
    if (iVar5 == 0x40b) {
      if (sVar1 == 0x38) {
        ByteString::resize(&der,0x44);
        puVar2 = ByteString::operator[](&der,0);
        builtin_memcpy(puVar2,"0B0\x05\x06\x03+eo\x039",0xc);
        puVar2 = ByteString::operator[](&der,0xc);
        puVar3 = ByteString::const_byte_str(&raw);
        *(undefined8 *)(puVar2 + 0x30) = *(undefined8 *)(puVar3 + 0x30);
        uVar7 = *(undefined4 *)puVar3;
        uVar8 = *(undefined4 *)(puVar3 + 4);
        uVar9 = *(undefined4 *)(puVar3 + 8);
        uVar10 = *(undefined4 *)(puVar3 + 0xc);
        uVar11 = *(undefined4 *)(puVar3 + 0x10);
        uVar12 = *(undefined4 *)(puVar3 + 0x14);
        uVar13 = *(undefined4 *)(puVar3 + 0x18);
        uVar14 = *(undefined4 *)(puVar3 + 0x1c);
        uVar15 = *(undefined4 *)(puVar3 + 0x20);
        uVar16 = *(undefined4 *)(puVar3 + 0x24);
        uVar17 = *(undefined4 *)(puVar3 + 0x28);
        uVar18 = *(undefined4 *)(puVar3 + 0x2c);
        goto LAB_0011f76f;
      }
      uVar6 = 0x38;
      iVar5 = 0xeb;
LAB_0011f7d7:
      softHSMLog(3,"createOSSLKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
                 ,iVar5,"Invalid size. Expected: %lu, Actual: %lu",uVar6,sVar1);
      goto LAB_0011f7fa;
    }
    if (iVar5 == 0x43f) {
      if (sVar1 != 0x20) {
        uVar6 = 0x20;
        iVar5 = 0xe1;
        goto LAB_0011f7d7;
      }
      ByteString::resize(&der,0x2c);
      puVar2 = ByteString::operator[](&der,0);
      builtin_memcpy(puVar2,"0*0\x05\x06\x03+ep\x03!",0xc);
      puVar2 = ByteString::operator[](&der,0xc);
      puVar3 = ByteString::const_byte_str(&raw);
    }
    else {
      if (iVar5 != 0x40a) goto LAB_0011f7fa;
      if (sVar1 != 0x20) {
        uVar6 = 0x20;
        iVar5 = 0xd7;
        goto LAB_0011f7d7;
      }
      ByteString::resize(&der,0x2c);
      puVar2 = ByteString::operator[](&der,0);
      builtin_memcpy(puVar2,"0*0\x05\x06\x03+en\x03!",0xc);
      puVar2 = ByteString::operator[](&der,0xc);
      puVar3 = ByteString::const_byte_str(&raw);
    }
    uVar7 = *(undefined4 *)puVar3;
    uVar8 = *(undefined4 *)(puVar3 + 4);
    uVar9 = *(undefined4 *)(puVar3 + 8);
    uVar10 = *(undefined4 *)(puVar3 + 0xc);
    uVar11 = *(undefined4 *)(puVar3 + 0x10);
    uVar12 = *(undefined4 *)(puVar3 + 0x14);
    uVar13 = *(undefined4 *)(puVar3 + 0x18);
    uVar14 = *(undefined4 *)(puVar3 + 0x1c);
  }
  *(undefined4 *)(puVar2 + 0x10) = uVar11;
  *(undefined4 *)(puVar2 + 0x14) = uVar12;
  *(undefined4 *)(puVar2 + 0x18) = uVar13;
  *(undefined4 *)(puVar2 + 0x1c) = uVar14;
  *(undefined4 *)puVar2 = uVar7;
  *(undefined4 *)(puVar2 + 4) = uVar8;
  *(undefined4 *)(puVar2 + 8) = uVar9;
  *(undefined4 *)(puVar2 + 0xc) = uVar10;
  p = ByteString::operator[](&der,0);
  sVar1 = ByteString::size(&der);
  pEVar4 = d2i_PUBKEY((EVP_PKEY **)0x0,&p,sVar1);
  this->pkey = (EVP_PKEY *)pEVar4;
LAB_0011f7fa:
  ByteString::~ByteString(&raw);
  ByteString::~ByteString(&der);
  return;
}

Assistant:

void OSSLEDPublicKey::createOSSLKey()
{
	if (pkey != NULL) return;

	ByteString der;
	ByteString raw = DERUTIL::octet2Raw(a);
	size_t len = raw.size();
	if (len == 0) return;

	switch (nid) {
	case NID_X25519:
		if (len != X25519_KEYLEN)
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", X25519_KEYLEN, len);
			return;
		}
		der.resize(PREFIXLEN + X25519_KEYLEN);
		memcpy(&der[0], x25519_prefix, PREFIXLEN);
		memcpy(&der[PREFIXLEN], raw.const_byte_str(), X25519_KEYLEN);
		break;
	case NID_ED25519:
		if (len != X25519_KEYLEN)
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", X25519_KEYLEN, len);
			return;
		}
		der.resize(PREFIXLEN + X25519_KEYLEN);
		memcpy(&der[0], ed25519_prefix, PREFIXLEN);
		memcpy(&der[PREFIXLEN], raw.const_byte_str(), X25519_KEYLEN);
		break;
	case NID_X448:
		if (len != X448_KEYLEN)
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", X448_KEYLEN, len);
			return;
		}
		der.resize(PREFIXLEN + X448_KEYLEN);
		memcpy(&der[0], x448_prefix, PREFIXLEN);
		memcpy(&der[PREFIXLEN], raw.const_byte_str(), X448_KEYLEN);
		break;
	case NID_ED448:
		if (len != ED448_KEYLEN)
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", ED448_KEYLEN, len);
			return;
		}
		der.resize(PREFIXLEN + ED448_KEYLEN);
		memcpy(&der[0], ed448_prefix, PREFIXLEN);
		memcpy(&der[PREFIXLEN], raw.const_byte_str(), ED448_KEYLEN);
		break;
	default:
		return;
	}
	const unsigned char *p = &der[0];
	pkey = d2i_PUBKEY(NULL, &p, (long)der.size());
}